

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O0

void jinit_arith_encoder(j_compress_ptr cinfo)

{
  undefined8 *puVar1;
  long in_RDI;
  int i;
  arith_entropy_ptr entropy;
  int local_14;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x170);
  *(undefined8 **)(in_RDI + 0x230) = puVar1;
  *puVar1 = start_pass;
  puVar1[2] = finish_pass;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    puVar1[(long)local_14 + 0xd] = 0;
    puVar1[(long)local_14 + 0x1d] = 0;
  }
  *(undefined1 *)(puVar1 + 0x2d) = 0x71;
  return;
}

Assistant:

GLOBAL(void)
jinit_arith_encoder (j_compress_ptr cinfo)
{
  arith_entropy_ptr entropy;
  int i;

  entropy = (arith_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(arith_entropy_encoder));
  cinfo->entropy = (struct jpeg_entropy_encoder *) entropy;
  entropy->pub.start_pass = start_pass;
  entropy->pub.finish_pass = finish_pass;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_ARITH_TBLS; i++) {
    entropy->dc_stats[i] = NULL;
    entropy->ac_stats[i] = NULL;
  }

  /* Initialize index for fixed probability estimation */
  entropy->fixed_bin[0] = 113;
}